

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opaque.c
# Opt level: O0

exr_result_t
exr_attr_opaquedata_pack(exr_context_t ctxt,exr_attr_opaquedata_t *u,int32_t *sz,void **packed)

{
  int iVar1;
  exr_result_t eVar2;
  long lVar3;
  long *in_RCX;
  int *in_RDX;
  int *in_RSI;
  long in_RDI;
  undefined8 in_R9;
  void *tmpptr;
  int32_t nsize;
  exr_result_t rv;
  int local_30;
  int local_2c;
  long *local_28;
  int *local_20;
  int *local_18;
  long local_10;
  int local_4;
  
  local_30 = 0;
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else {
    if (in_RDX != (int *)0x0) {
      *in_RDX = 0;
    }
    if (in_RCX != (long *)0x0) {
      *in_RCX = 0;
    }
    if (in_RSI == (int *)0x0) {
      local_4 = (**(code **)(in_RDI + 0x40))
                          (in_RDI,3,"Invalid reference to opaque data object to initialize");
    }
    else if (*(long *)(in_RSI + 4) == 0) {
      if (*(long *)(in_RSI + 10) == 0) {
        local_4 = (**(code **)(in_RDI + 0x40))
                            (in_RDI,3,"No pack provider specified for opaque data");
      }
      else {
        local_28 = in_RCX;
        local_20 = in_RDX;
        local_18 = in_RSI;
        local_10 = in_RDI;
        local_2c = (**(code **)(in_RSI + 10))
                             (in_RDI,*(undefined8 *)(in_RSI + 6),in_RSI[1],&local_30,0,in_R9,0);
        if (local_2c == 0) {
          iVar1 = 0;
          if (0 < local_30) {
            lVar3 = (**(code **)(local_10 + 0x58))((long)local_30);
            if (lVar3 == 0) {
              eVar2 = (**(code **)(local_10 + 0x38))(local_10,1);
              return eVar2;
            }
            local_18[2] = local_30;
            local_2c = (**(code **)(local_18 + 10))
                                 (local_10,*(undefined8 *)(local_18 + 6),local_18[1],&local_30,lVar3
                                 );
            if (local_2c != 0) {
              (**(code **)(local_10 + 0x60))(lVar3);
              local_30 = local_18[2];
              local_18[2] = 0;
              eVar2 = (**(code **)(local_10 + 0x48))
                                (local_10,local_2c,
                                 "Pack function failed to pack data, unpacked size %d, packed buffer size %d"
                                 ,local_18[1],local_30);
              return eVar2;
            }
            *local_18 = local_30;
            *(long *)(local_18 + 4) = lVar3;
            if (local_20 != (int *)0x0) {
              *local_20 = local_30;
            }
            if (local_28 != (long *)0x0) {
              *local_28 = lVar3;
            }
            if (*(long *)(local_18 + 0xc) != 0) {
              (**(code **)(local_18 + 0xc))(local_10,*(undefined8 *)(local_18 + 6),local_18[1]);
            }
            local_18[6] = 0;
            local_18[7] = 0;
            local_18[1] = 0;
            iVar1 = local_2c;
          }
          local_2c = iVar1;
          local_4 = local_2c;
        }
        else {
          local_4 = (**(code **)(local_10 + 0x48))
                              (local_10,local_2c,
                               "Pack function failed finding pack buffer size, unpacked size %d",
                               local_18[1]);
        }
      }
    }
    else {
      if (in_RDX != (int *)0x0) {
        *in_RDX = *in_RSI;
      }
      if (in_RCX != (long *)0x0) {
        *in_RCX = *(long *)(in_RSI + 4);
      }
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_opaquedata_pack (
    exr_context_t ctxt, exr_attr_opaquedata_t* u, int32_t* sz, void** packed)
{
    exr_result_t rv;
    int32_t      nsize  = 0;
    void*        tmpptr = NULL;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (sz) *sz = 0;
    if (packed) *packed = NULL;

    if (!u)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to opaque data object to initialize");

    if (u->packed_data)
    {
        if (sz) *sz = u->size;
        if (packed) *packed = u->packed_data;
        return EXR_ERR_SUCCESS;
    }

    if (!u->pack_func_ptr)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "No pack provider specified for opaque data");

    rv = u->pack_func_ptr (
        ctxt, u->unpacked_data, u->unpacked_size, &nsize, NULL);
    if (rv != EXR_ERR_SUCCESS)
        return ctxt->print_error (
            ctxt,
            rv,
            "Pack function failed finding pack buffer size, unpacked size %d",
            u->unpacked_size);

    if (nsize > 0)
    {
        tmpptr = ctxt->alloc_fn ((size_t) nsize);
        if (tmpptr == NULL)
            return ctxt->standard_error (ctxt, EXR_ERR_OUT_OF_MEMORY);

        u->packed_alloc_size = nsize;

        rv = u->pack_func_ptr (
            ctxt, u->unpacked_data, u->unpacked_size, &nsize, tmpptr);
        if (rv != EXR_ERR_SUCCESS)
        {
            ctxt->free_fn (tmpptr);
            nsize                = u->packed_alloc_size;
            u->packed_alloc_size = 0;
            return ctxt->print_error (
                ctxt,
                rv,
                "Pack function failed to pack data, unpacked size %d, packed buffer size %d",
                u->unpacked_size,
                nsize);
        }
        u->size        = nsize;
        u->packed_data = tmpptr;
        if (sz) *sz = nsize;
        if (packed) *packed = tmpptr;

        if (u->destroy_unpacked_func_ptr)
            u->destroy_unpacked_func_ptr (
                ctxt, u->unpacked_data, u->unpacked_size);
        u->unpacked_data = NULL;
        u->unpacked_size = 0;
    }
    return rv;
}